

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O1

int dynamicGetchar(gdIOCtxPtr ctx)

{
  int iVar1;
  uint uVar2;
  uchar b;
  byte local_9;
  
  iVar1 = dynamicGetbuf(ctx,&local_9,1);
  uVar2 = 0xffffffff;
  if (iVar1 == 1) {
    uVar2 = (uint)local_9;
  }
  return uVar2;
}

Assistant:

static int dynamicGetchar(gdIOCtxPtr ctx)
{
	unsigned char b;
	int rv;

	rv = dynamicGetbuf(ctx, &b, 1);

	if(rv != 1) {
		return EOF;
	} else {
		return b; /* (b & 0xff); */
	}
}